

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_binder.cpp
# Opt level: O3

BindResult * __thiscall
duckdb::ConstantBinder::BindExpression
          (BindResult *__return_storage_ptr__,ConstantBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr_ptr,idx_t depth,bool root_expression)

{
  ExpressionClass EVar1;
  pointer pcVar2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var3;
  _Alloc_hider _Var4;
  bool bVar5;
  pointer __p;
  BaseExpression *this_00;
  ColumnRefExpression *this_01;
  string *psVar6;
  BinderException *this_02;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  idx_t local_38;
  
  this_00 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator*(expr_ptr)->super_BaseExpression;
  EVar1 = this_00->expression_class;
  if (EVar1 < SUBQUERY) {
    if (EVar1 == COLUMN_REF) {
      local_38 = depth;
      this_01 = BaseExpression::Cast<duckdb::ColumnRefExpression>(this_00);
      bVar5 = ColumnRefExpression::IsQualified(this_01);
      if (!bVar5) {
        psVar6 = ColumnRefExpression::GetColumnName_abi_cxx11_(this_01);
        (*(this->super_ExpressionBinder)._vptr_ExpressionBinder[6])(&local_58,this,psVar6);
        _Var4._M_p = local_58._M_dataplus._M_p;
        if ((ParsedExpression *)local_58._M_dataplus._M_p != (ParsedExpression *)0x0) {
          local_58._M_dataplus._M_p = (pointer)0x0;
          _Var3._M_head_impl =
               (expr_ptr->
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          (expr_ptr->
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               (ParsedExpression *)_Var4._M_p;
          if (_Var3._M_head_impl != (ParsedExpression *)0x0) {
            (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
          }
          (*(this->super_ExpressionBinder)._vptr_ExpressionBinder[5])
                    (__return_storage_ptr__,this,expr_ptr,local_38,root_expression);
          if ((long *)local_58._M_dataplus._M_p == (long *)0x0) {
            return __return_storage_ptr__;
          }
          (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
          return __return_storage_ptr__;
        }
      }
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      pcVar2 = (this->clause)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar2,pcVar2 + (this->clause)._M_string_length);
      ::std::__cxx11::string::append((char *)&local_58);
      ExpressionBinder::BindUnsupportedExpression
                (__return_storage_ptr__,&this->super_ExpressionBinder,(ParsedExpression *)this_00,
                 local_38,&local_58);
    }
    else {
      if (EVar1 != DEFAULT) goto LAB_011f5925;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      pcVar2 = (this->clause)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar2,pcVar2 + (this->clause)._M_string_length);
      ::std::__cxx11::string::append((char *)&local_58);
      ExpressionBinder::BindUnsupportedExpression
                (__return_storage_ptr__,&this->super_ExpressionBinder,(ParsedExpression *)this_00,
                 depth,&local_58);
    }
  }
  else {
    if (EVar1 != WINDOW) {
      if (EVar1 == SUBQUERY) {
        this_02 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::operator+(&local_58,&this->clause," cannot contain subqueries");
        BinderException::BinderException(this_02,&local_58);
        __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
LAB_011f5925:
      ExpressionBinder::BindExpression
                (__return_storage_ptr__,&this->super_ExpressionBinder,expr_ptr,depth,false);
      return __return_storage_ptr__;
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    pcVar2 = (this->clause)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar2,pcVar2 + (this->clause)._M_string_length);
    ::std::__cxx11::string::append((char *)&local_58);
    ExpressionBinder::BindUnsupportedExpression
              (__return_storage_ptr__,&this->super_ExpressionBinder,(ParsedExpression *)this_00,
               depth,&local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult ConstantBinder::BindExpression(unique_ptr<ParsedExpression> &expr_ptr, idx_t depth, bool root_expression) {
	auto &expr = *expr_ptr;
	switch (expr.GetExpressionClass()) {
	case ExpressionClass::COLUMN_REF: {
		auto &colref = expr.Cast<ColumnRefExpression>();
		if (!colref.IsQualified()) {
			auto value_function = GetSQLValueFunction(colref.GetColumnName());
			if (value_function) {
				expr_ptr = std::move(value_function);
				return BindExpression(expr_ptr, depth, root_expression);
			}
		}
		return BindUnsupportedExpression(expr, depth, clause + " cannot contain column names");
	}
	case ExpressionClass::SUBQUERY:
		throw BinderException(clause + " cannot contain subqueries");
	case ExpressionClass::DEFAULT:
		return BindUnsupportedExpression(expr, depth, clause + " cannot contain DEFAULT clause");
	case ExpressionClass::WINDOW:
		return BindUnsupportedExpression(expr, depth, clause + " cannot contain window functions!");
	default:
		return ExpressionBinder::BindExpression(expr_ptr, depth);
	}
}